

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

DiagnosticSeverity __thiscall
slang::DiagnosticEngine::getSeverity(DiagnosticEngine *this,DiagCode code,SourceLocation location)

{
  group_type_pointer pgVar1;
  char cVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  DiagnosticSeverity DVar8;
  _Optional_payload_base<slang::DiagnosticSeverity> _Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  
  _Var9 = (_Optional_payload_base<slang::DiagnosticSeverity>)findMappedSeverity(this,code,location);
  if (((ulong)_Var9 >> 0x20 & 1) != 0) goto LAB_00243011;
  auVar19 = ZEXT416((int)code << 0x10 | (uint)code >> 0x10) * ZEXT816(0x9e3779b97f4a7c15);
  uVar12 = auVar19._8_8_ ^ auVar19._0_8_;
  uVar10 = uVar12 >> ((byte)(this->severityTable).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar12 & 0xff];
  ppVar4 = (this->severityTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           .arrays.elements_;
  uVar5 = (this->severityTable).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
          .arrays.groups_size_mask;
  uVar13 = 0;
  do {
    pgVar1 = (this->severityTable).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
             .arrays.groups_ + uVar10;
    bVar7 = pgVar1->m[0xf].n;
    uVar15 = (uchar)uVar3;
    auVar19[0] = -(pgVar1->m[0].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 8);
    auVar19[1] = -(pgVar1->m[1].n == uVar16);
    uVar17 = (uchar)((uint)uVar3 >> 0x10);
    auVar19[2] = -(pgVar1->m[2].n == uVar17);
    bVar18 = (byte)((uint)uVar3 >> 0x18);
    auVar19[3] = -(pgVar1->m[3].n == bVar18);
    auVar19[4] = -(pgVar1->m[4].n == uVar15);
    auVar19[5] = -(pgVar1->m[5].n == uVar16);
    auVar19[6] = -(pgVar1->m[6].n == uVar17);
    auVar19[7] = -(pgVar1->m[7].n == bVar18);
    auVar19[8] = -(pgVar1->m[8].n == uVar15);
    auVar19[9] = -(pgVar1->m[9].n == uVar16);
    auVar19[10] = -(pgVar1->m[10].n == uVar17);
    auVar19[0xb] = -(pgVar1->m[0xb].n == bVar18);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
    auVar19[0xf] = -(bVar7 == bVar18);
    for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
        uVar14 = uVar14 - 1 & uVar14) {
      uVar6 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if (ppVar4[uVar10 * 0xf + (ulong)uVar6].first == code) {
        _Var9._4_4_ = 0;
        _Var9._M_payload._M_value = ppVar4[uVar10 * 0xf + (ulong)uVar6].second;
        goto LAB_00243011;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar7) == 0) break;
    lVar11 = uVar10 + uVar13;
    uVar13 = uVar13 + 1;
    uVar10 = lVar11 + 1U & uVar5;
  } while (uVar13 <= uVar5);
  DVar8 = getDefaultSeverity(code);
  switch(DVar8) {
  case Note:
    if (this->ignoreAllNotes != false) {
LAB_00243000:
      _Var9._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x0;
      _Var9._M_engaged = false;
      _Var9._5_3_ = 0;
      goto LAB_00243011;
    }
    goto switchD_00242fcf_default;
  case Warning:
    if (this->ignoreAllWarnings != false) goto LAB_00243000;
    _Var9._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x3;
    _Var9._M_engaged = false;
    _Var9._5_3_ = 0;
    cVar2 = this->warningsAsErrors;
    break;
  case Error:
    _Var9._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x4;
    _Var9._M_engaged = false;
    _Var9._5_3_ = 0;
    cVar2 = this->errorsAsFatal;
    break;
  case Fatal:
    _Var9._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x3;
    _Var9._M_engaged = false;
    _Var9._5_3_ = 0;
    cVar2 = this->fatalsAsErrors;
    break;
  default:
    goto switchD_00242fcf_default;
  }
  if (cVar2 == '\0') {
switchD_00242fcf_default:
    _Var9._4_4_ = 0;
    _Var9._M_payload._M_value = DVar8;
  }
LAB_00243011:
  return (DiagnosticSeverity)_Var9._M_payload;
}

Assistant:

DiagnosticSeverity DiagnosticEngine::getSeverity(DiagCode code, SourceLocation location) const {
    // Check if we have an in-source severity configured.
    if (auto sev = findMappedSeverity(code, location); sev.has_value())
        return *sev;

    if (auto it = severityTable.find(code); it != severityTable.end())
        return it->second;

    auto result = getDefaultSeverity(code);
    switch (result) {
        case DiagnosticSeverity::Ignored:
            break;
        case DiagnosticSeverity::Note:
            if (ignoreAllNotes)
                return DiagnosticSeverity::Ignored;
            break;
        case DiagnosticSeverity::Warning:
            if (ignoreAllWarnings)
                return DiagnosticSeverity::Ignored;
            if (warningsAsErrors)
                return DiagnosticSeverity::Error;
            break;
        case DiagnosticSeverity::Error:
            if (errorsAsFatal)
                return DiagnosticSeverity::Fatal;
            break;
        case DiagnosticSeverity::Fatal:
            if (fatalsAsErrors)
                return DiagnosticSeverity::Error;
            break;
    }
    return result;
}